

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O3

TValue * trace_state(lua_State *L,lua_CFunction dummy,void *ud)

{
  byte *pbVar1;
  global_State *g;
  void *__dest;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  lua_State *plVar5;
  char *pcVar6;
  TValue *pTVar7;
  uint64_t uVar8;
  undefined8 *puVar9;
  int *piVar10;
  long lVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  uint uVar14;
  BCPos BVar15;
  ushort *puVar16;
  uint64_t uVar17;
  ptrdiff_t pVar18;
  GCstr *pGVar19;
  cTValue *nextframe;
  long lVar20;
  int iVar21;
  TValue *pTVar22;
  undefined8 *puVar23;
  undefined8 *puVar24;
  ulong uVar25;
  GCfunc *fn;
  byte bVar26;
  double dVar27;
  int local_34;
  
  bVar26 = 0;
  g = (global_State *)((long)ud + -0x2e0);
LAB_0011a615:
  switch(*(undefined4 *)((long)ud + 0xec)) {
  case 0x11:
    goto switchD_0011a62e_caseD_11;
  case 0x12:
switchD_0011a62e_caseD_12:
    *(undefined4 *)((long)ud + 0xec) = 0x11;
    goto switchD_0011a62e_caseD_11;
  case 0x13:
    *(undefined4 *)((long)ud + 0xec) = 0x11;
    trace_start((jit_State *)ud);
    lj_dispatch_update(g);
    uVar14 = *(uint *)((long)ud + 0xec);
    if (uVar14 == 0x12) goto switchD_0011a62e_caseD_12;
    break;
  case 0x14:
    if (*(undefined4 **)((long)ud + 0xbd8) != (undefined4 *)0x0) {
      **(undefined4 **)((long)ud + 0xbd8) = *(undefined4 *)((long)ud + 0xbe0);
      *(undefined8 *)((long)ud + 0xbd8) = 0;
    }
    *(undefined4 *)((long)ud + 0x158) = 0;
    if ((((*(byte *)((long)ud + 0xaa) & 0x40) != 0) &&
        (*(short *)((long)ud + 0x6a) == *(short *)((long)ud + 0x68))) &&
       (*(int *)((long)ud + 0xfc) + *(int *)((long)ud + 0x100) == 0)) {
      *(undefined4 *)((long)ud + -0x228) = 0xfffffffa;
      lj_opt_dce((jit_State *)ud);
      iVar21 = lj_opt_loop((jit_State *)ud);
      if (iVar21 != 0) {
        *(undefined2 *)((long)ud + 0x6a) = 0;
        *(undefined1 *)((long)ud + 0x74) = 0;
        *(undefined4 *)((long)ud + 0x158) = *(undefined4 *)((long)ud + 0xc);
        *(undefined4 *)((long)ud + 0xec) = 0x11;
        return (TValue *)0x0;
      }
      *(uint *)((long)ud + 0x158) = (uint)*(ushort *)((long)ud + 0x1b4);
    }
    lj_opt_sink((jit_State *)ud);
    if (*(int *)((long)ud + 0x158) == 0) {
      *(undefined1 *)(*(long *)((long)ud + 0x30) + -1 + (ulong)*(ushort *)((long)ud + 10) * 0xc) =
           0xff;
    }
    *(undefined4 *)((long)ud + 0xec) = 0x15;
    uVar14 = 0x15;
    break;
  case 0x15:
    *(undefined4 *)((long)ud + -0x228) = 0xfffffff9;
    lj_asm_trace((jit_State *)ud,(GCtrace *)ud);
    uVar14 = *(uint *)((long)ud + 0x50);
    uVar2 = *(ushort *)((long)ud + 0x68);
    puVar9 = *(undefined8 **)((long)ud + 0x78);
    if (0x18 < (uVar14 & 0xff) - 0x41) goto switchD_0011acb2_caseD_43;
    lVar20 = *(long *)((long)ud + 0x40);
    piVar10 = *(int **)((long)ud + 0x48);
    switch(uVar14 & 0xff) {
    case 0x41:
    case 0x42:
    case 0x45:
      *(ushort *)
       (*(long *)(*(long *)((long)ud + 0x180) + (ulong)*(uint *)((long)ud + 0xbcc) * 8) + 0x6a) =
           uVar2;
      break;
    case 0x46:
    case 0x4a:
    case 0x4b:
    case 0x4c:
      *piVar10 = (uint)*(byte *)(*(long *)((long)ud + 0x30) + 8) * 0x100 + (uint)uVar2 * 0x10000 +
                 0x57;
      goto LAB_0011ad1e;
    case 0x4f:
      *(char *)(piVar10 + ((ulong)(uVar14 >> 0x10) - 0x8000)) = 'N';
    case 0x52:
    case 0x55:
    case 0x59:
      *(char *)piVar10 = (char)uVar14 + '\x02';
      *(ushort *)((long)piVar10 + 2) = uVar2;
LAB_0011ad1e:
      *(undefined2 *)((long)ud + 0x6e) = *(undefined2 *)(lVar20 + 0x3e);
      *(ushort *)(lVar20 + 0x3e) = uVar2;
      break;
    case 0x58:
      lj_asm_patchexit((jit_State *)ud,
                       *(GCtrace **)
                        (*(long *)((long)ud + 0x180) + (ulong)*(uint *)((long)ud + 0xbc8) * 8),
                       *(ExitNo *)((long)ud + 0xbcc),*(MCode **)((long)ud + 0x58));
      lVar20 = *(long *)((long)ud + 0x180);
      lVar11 = *(long *)(*(long *)(lVar20 + (ulong)*(uint *)((long)ud + 0xbc8) * 8) + 0x30);
      uVar25 = (ulong)*(uint *)((long)ud + 0xbcc);
      *(undefined1 *)(lVar11 + 0xb + uVar25 * 0xc) = 0xff;
      if (*(byte *)(lVar11 + 9 + uVar25 * 0xc) < *(byte *)((long)ud + 0x73)) {
        *(byte *)(lVar11 + uVar25 * 0xc + 9) = *(byte *)((long)ud + 0x73);
      }
      lVar20 = *(long *)(lVar20 + (ulong)*(ushort *)((long)ud + 0x6c) * 8);
      *(short *)(lVar20 + 100) = *(short *)(lVar20 + 100) + 1;
      *(undefined2 *)((long)ud + 0x70) = *(undefined2 *)(lVar20 + 0x70);
      *(ushort *)(lVar20 + 0x70) = uVar2;
    }
switchD_0011acb2_caseD_43:
    lj_mcode_commit((jit_State *)ud,*(MCode **)((long)ud + 0x58));
    *(undefined4 *)((long)ud + 0x174) = 0;
    iVar21 = *(int *)((long)ud + 0xc);
    iVar4 = *(int *)((long)ud + 0x28);
    puVar23 = (undefined8 *)ud;
    puVar24 = puVar9;
    for (lVar20 = 0xf; lVar20 != 0; lVar20 = lVar20 + -1) {
      *puVar24 = *puVar23;
      puVar23 = puVar23 + (ulong)bVar26 * -2 + 1;
      puVar24 = puVar24 + (ulong)bVar26 * -2 + 1;
    }
    *puVar9 = *(undefined8 *)((long)ud + -0x2b8);
    *(undefined8 **)((long)ud + -0x2b8) = puVar9;
    *(byte *)(puVar9 + 1) = *(byte *)((long)ud + -0x2c0) & 3;
    *(undefined1 *)((long)puVar9 + 9) = 9;
    puVar9[4] = puVar9 + (0xf - (ulong)*(uint *)((long)ud + 0x28));
    puVar23 = puVar9 + (ulong)(uint)(iVar21 - iVar4) + 0xf;
    puVar9[6] = puVar23;
    memcpy(puVar23,*(void **)((long)ud + 0x30),(ulong)*(ushort *)((long)ud + 10) * 0xc);
    __dest = (void *)((long)puVar23 + (ulong)*(ushort *)((long)ud + 10) * 0xc);
    puVar9[7] = __dest;
    memcpy(__dest,*(void **)((long)ud + 0x38),(ulong)*(uint *)((long)ud + 0x2c) << 2);
    *(undefined2 *)((long)ud + 0x68) = 0;
    *(undefined8 *)((long)ud + 0x78) = 0;
    uVar3 = *(ushort *)(puVar9 + 0xd);
    *(undefined8 **)(*(long *)((long)ud + 0x180) + (ulong)uVar3 * 8) = puVar9;
    lj_gc_barriertrace(g,(uint)uVar3);
    plVar5 = *(lua_State **)((long)ud + 0x80);
    if (((*(byte *)((plVar5->glref).ptr64 + 0x93) & 2) != 0) &&
       (pVar18 = lj_vmevent_prepare(plVar5,LJ_VMEVENT_TRACE), pVar18 != 0)) {
      pTVar22 = plVar5->top;
      plVar5->top = pTVar22 + 1;
      pGVar19 = lj_str_new(plVar5,"stop",4);
      pTVar22->u64 = (ulong)pGVar19 | 0xfffd800000000000;
      pTVar22 = plVar5->top;
      plVar5->top = pTVar22 + 1;
      pTVar22->n = (double)uVar2;
      pTVar22 = plVar5->top;
      plVar5->top = pTVar22 + 1;
      pTVar22->u64 = *(ulong *)((long)ud + 0x90) | 0xfffb800000000000;
      lj_vmevent_call(plVar5,pVar18);
    }
    *(undefined4 *)((long)ud + -0x228) = 0xffffffff;
    *(undefined4 *)((long)ud + 0xec) = 0;
LAB_0011ac52:
    lj_dispatch_update(g);
    return (TValue *)0x0;
  case 0x16:
    goto switchD_0011a62e_caseD_16;
  default:
    pTVar22 = L->top;
    L->top = pTVar22 + 1;
    pTVar22->u64 = 0;
switchD_0011a62e_caseD_16:
    if (*(undefined4 **)((long)ud + 0xbd8) != (undefined4 *)0x0) {
      **(undefined4 **)((long)ud + 0xbd8) = *(undefined4 *)((long)ud + 0xbe0);
      *(undefined8 *)((long)ud + 0xbd8) = 0;
    }
    plVar5 = *(lua_State **)((long)ud + 0x80);
    *(undefined4 *)((long)ud + 0x174) = 0;
    lj_mcode_abort((jit_State *)ud);
    if (*(GCtrace **)((long)ud + 0x78) != (GCtrace *)0x0) {
      lj_trace_free(g,*(GCtrace **)((long)ud + 0x78));
      *(undefined8 *)((long)ud + 0x78) = 0;
    }
    pTVar22 = plVar5->top;
    iVar21 = 0;
    if ((0x1fff2 < pTVar22[-1].field_4.it >> 0xf) ||
       (iVar21 = (int)(double)pTVar22[-1].field_4, iVar21 != 0x1d)) {
      if ((*(int *)((long)ud + 0xbc8) == 0) && (*(byte *)((long)ud + 0x50) - 0x4d < 0xfffffffc)) {
        uVar14 = *(uint *)((long)ud + 0xbcc);
        if ((ulong)uVar14 == 0) {
          pcVar6 = *(char **)((long)ud + 0x48);
          if (iVar21 == 6) {
            *(undefined2 *)((long)ud + (ulong)((int)pcVar6 + 4U >> 1 & 0x7e) + 0xc48) = 1;
          }
          else {
            lVar20 = *(long *)((long)ud + 0x40);
            uVar25 = 0;
            puVar16 = (ushort *)((long)ud + 0x728);
            do {
              if (*(char **)(puVar16 + -4) == pcVar6) {
                uVar2 = *puVar16;
                uVar17 = lj_prng_u64((PRNGState *)((long)ud + 0xc28));
                uVar14 = ((uint)uVar17 & 0xf) + (uint)uVar2 * 2;
                if (uVar14 < 0xea61) goto LAB_0011a9ab;
                if (*pcVar6 == 'F') {
                  *pcVar6 = 'E';
                  pcVar6[(ulong)*(ushort *)(pcVar6 + 6) * 4 + -0x1fffc] = 'X';
                }
                else {
                  *pcVar6 = *pcVar6 + '\x01';
                  pbVar1 = (byte *)(lVar20 + 0x3d);
                  *pbVar1 = *pbVar1 | 0x10;
                }
                goto LAB_0011a9cf;
              }
              uVar25 = uVar25 + 1;
              puVar16 = puVar16 + 8;
            } while (uVar25 != 0x40);
            uVar25 = (ulong)*(uint *)((long)ud + 0xb20);
            *(uint *)((long)ud + 0xb20) = *(uint *)((long)ud + 0xb20) + 1 & 0x3f;
            *(char **)((long)ud + uVar25 * 0x10 + 0x720) = pcVar6;
            uVar14 = 0x48;
LAB_0011a9ab:
            *(short *)((long)ud + uVar25 * 0x10 + 0x728) = (short)uVar14;
            *(short *)((long)ud + uVar25 * 0x10 + 0x72a) = (short)iVar21;
            *(short *)((long)ud + (ulong)((int)pcVar6 + 4U >> 1 & 0x7e) + 0xc48) = (short)uVar14;
LAB_0011a9cf:
            pTVar22 = plVar5->top;
          }
        }
        else {
          *(short *)(*(long *)(*(long *)((long)ud + 0x180) + (ulong)uVar14 * 8) + 0x6a) =
               (short)uVar14;
        }
      }
      uVar2 = *(ushort *)((long)ud + 0x68);
      if (uVar2 != 0) {
        uVar17 = (plVar5->stack).ptr64;
        *(undefined2 *)((long)ud + 0x6a) = 0;
        *(undefined1 *)((long)ud + 0x74) = 0;
        if (((*(byte *)((plVar5->glref).ptr64 + 0x93) & 2) != 0) &&
           (pVar18 = lj_vmevent_prepare(plVar5,LJ_VMEVENT_TRACE), pVar18 != 0)) {
          pTVar7 = plVar5->top;
          plVar5->top = pTVar7 + 1;
          pGVar19 = lj_str_new(plVar5,"abort",5);
          pTVar7->u64 = (ulong)pGVar19 | 0xfffd800000000000;
          pTVar7 = plVar5->top;
          plVar5->top = pTVar7 + 1;
          pTVar7->n = (double)uVar2;
          nextframe = lj_debug_frame(plVar5,0,&local_34);
          fn = (GCfunc *)(nextframe[-1].u64 & 0x7fffffffffff);
          if ((nextframe == plVar5->base + -1) && ((fn->c).ffid == '\0')) {
            BVar15 = (BCPos)(*(long *)((long)ud + 0x88) - (fn->c).pc.ptr64 >> 2);
          }
          else {
            BVar15 = lj_debug_framepc(plVar5,fn,nextframe);
          }
          pTVar7 = plVar5->top;
          plVar5->top = pTVar7 + 1;
          pTVar7->u64 = (ulong)fn | 0xfffb800000000000;
          pTVar7 = plVar5->top;
          plVar5->top = pTVar7 + 1;
          pTVar7->n = (double)(int)BVar15;
          pTVar7 = plVar5->top;
          uVar8 = (plVar5->stack).ptr64;
          plVar5->top = pTVar7 + 1;
          *pTVar7 = *(TValue *)((long)pTVar22 + uVar8 + (-8 - uVar17));
          pTVar22 = plVar5->top;
          plVar5->top = pTVar22 + 1;
          *pTVar22 = *(TValue *)((long)ud + 0xc10);
          lj_vmevent_call(plVar5,pVar18);
        }
        *(undefined8 *)(*(long *)((long)ud + 0x180) + (ulong)(uint)uVar2 * 8) = 0;
        if ((uint)uVar2 < *(uint *)((long)ud + 0x188)) {
          *(uint *)((long)ud + 0x188) = (uint)uVar2;
        }
        *(undefined2 *)((long)ud + 0x68) = 0;
        pTVar22 = plVar5->top;
      }
      plVar5->top = pTVar22 + -1;
      if (iVar21 == 0xe) {
        if (**(char **)((long)ud + 0x88) != 'I') {
          *(undefined8 *)((long)ud + 0xbc8) = 0;
          *(undefined4 *)((long)ud + 0xec) = 0x11;
          trace_start((jit_State *)ud);
          goto LAB_0011a615;
        }
      }
      else if (iVar21 == 0x1b) {
        lj_trace_flushall(plVar5);
      }
      *(undefined4 *)((long)ud + -0x228) = 0xffffffff;
      *(undefined4 *)((long)ud + 0xec) = 0;
      goto LAB_0011ac52;
    }
    plVar5->top = pTVar22 + -1;
    *(undefined4 *)((long)ud + 0xec) = 0x15;
    goto LAB_0011a615;
  }
LAB_0011a80d:
  if (uVar14 < 0x12) {
    return (TValue *)0x0;
  }
  goto LAB_0011a615;
switchD_0011a62e_caseD_11:
  if (*(undefined4 **)((long)ud + 0xbd8) != (undefined4 *)0x0) {
    if (*(char *)((long)ud + 0xb7) == '\0') {
      **(undefined4 **)((long)ud + 0xbd8) = *(undefined4 *)((long)ud + 0xbe0);
      *(undefined8 *)((long)ud + 0xbd8) = 0;
    }
    else {
      *(undefined1 *)((long)ud + 0xb7) = 0;
    }
  }
  *(undefined4 *)((long)ud + -0x228) = 0xfffffffb;
  if (((*(byte *)((L->glref).ptr64 + 0x93) & 4) != 0) &&
     (pVar18 = lj_vmevent_prepare(L,LJ_VMEVENT_RECORD), pVar18 != 0)) {
    uVar12 = *(undefined8 *)((long)ud + -0x1f8);
    uVar13 = *(undefined8 *)((long)ud + -0x1f0);
    pTVar22 = L->top;
    L->top = pTVar22 + 1;
    pTVar22->n = (double)*(ushort *)((long)ud + 0x68);
    pTVar22 = L->top;
    L->top = pTVar22 + 1;
    pTVar22->u64 = *(ulong *)((long)ud + 0x90) | 0xfffb800000000000;
    pTVar22 = L->top;
    L->top = pTVar22 + 1;
    dVar27 = -1.0;
    if (*(long *)((long)ud + 0x98) != 0) {
      dVar27 = (double)(int)((*(long *)((long)ud + 0x88) - *(long *)((long)ud + 0x98)) - 0x68U >> 2)
      ;
    }
    pTVar22->u64 = (uint64_t)dVar27;
    pTVar22 = L->top;
    L->top = pTVar22 + 1;
    pTVar22->n = (double)*(int *)((long)ud + 0xfc);
    lj_vmevent_call(L,pVar18);
    *(undefined8 *)((long)ud + -0x1f8) = uVar12;
    *(undefined8 *)((long)ud + -0x1f0) = uVar13;
  }
  lj_record_ins((jit_State *)ud);
  uVar14 = *(uint *)((long)ud + 0xec);
  goto LAB_0011a80d;
}

Assistant:

static TValue *trace_state(lua_State *L, lua_CFunction dummy, void *ud)
{
  jit_State *J = (jit_State *)ud;
  UNUSED(dummy);
  do {
  retry:
    switch (J->state) {
    case LJ_TRACE_START:
      J->state = LJ_TRACE_RECORD;  /* trace_start() may change state. */
      trace_start(J);
      lj_dispatch_update(J2G(J));
      if (J->state != LJ_TRACE_RECORD_1ST)
	break;
      /* fallthrough */

    case LJ_TRACE_RECORD_1ST:
      J->state = LJ_TRACE_RECORD;
      /* fallthrough */
    case LJ_TRACE_RECORD:
      trace_pendpatch(J, 0);
      setvmstate(J2G(J), RECORD);
      lj_vmevent_send_(L, RECORD,
	/* Save/restore tmptv state for trace recorder. */
	TValue savetv = J2G(J)->tmptv;
	TValue savetv2 = J2G(J)->tmptv2;
	setintV(L->top++, J->cur.traceno);
	setfuncV(L, L->top++, J->fn);
	setintV(L->top++, J->pt ? (int32_t)proto_bcpos(J->pt, J->pc) : -1);
	setintV(L->top++, J->framedepth);
      ,
	J2G(J)->tmptv = savetv;
	J2G(J)->tmptv2 = savetv2;
      );
      lj_record_ins(J);
      break;

    case LJ_TRACE_END:
      trace_pendpatch(J, 1);
      J->loopref = 0;
      if ((J->flags & JIT_F_OPT_LOOP) &&
	  J->cur.link == J->cur.traceno && J->framedepth + J->retdepth == 0) {
	setvmstate(J2G(J), OPT);
	lj_opt_dce(J);
	if (lj_opt_loop(J)) {  /* Loop optimization failed? */
	  J->cur.link = 0;
	  J->cur.linktype = LJ_TRLINK_NONE;
	  J->loopref = J->cur.nins;
	  J->state = LJ_TRACE_RECORD;  /* Try to continue recording. */
	  break;
	}
	J->loopref = J->chain[IR_LOOP];  /* Needed by assembler. */
      }
      lj_opt_split(J);
      lj_opt_sink(J);
      if (!J->loopref) J->cur.snap[J->cur.nsnap-1].count = SNAPCOUNT_DONE;
      J->state = LJ_TRACE_ASM;
      break;

    case LJ_TRACE_ASM:
      setvmstate(J2G(J), ASM);
      lj_asm_trace(J, &J->cur);
      trace_stop(J);
      setvmstate(J2G(J), INTERP);
      J->state = LJ_TRACE_IDLE;
      lj_dispatch_update(J2G(J));
      return NULL;

    default:  /* Trace aborted asynchronously. */
      setintV(L->top++, (int32_t)LJ_TRERR_RECERR);
      /* fallthrough */
    case LJ_TRACE_ERR:
      trace_pendpatch(J, 1);
      if (trace_abort(J))
	goto retry;
      setvmstate(J2G(J), INTERP);
      J->state = LJ_TRACE_IDLE;
      lj_dispatch_update(J2G(J));
      return NULL;
    }
  } while (J->state > LJ_TRACE_RECORD);
  return NULL;
}